

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase125::run(TestCase125 *this)

{
  PointerBuilder builder_00;
  PointerReader reader;
  PointerReader reader_00;
  Builder builder_01;
  Builder builder_02;
  Reader reader_01;
  Builder builder_03;
  Reader reader_02;
  Builder reader_03;
  Reader reader_04;
  PointerBuilder builder_04;
  Builder builder_05;
  Builder builder_06;
  Type TVar1;
  anon_union_8_2_eba6ea51_for_Type_5 aVar3;
  ListElementCount LVar4;
  undefined4 uVar5;
  uint uVar6;
  bool bVar7;
  ListSchema LVar8;
  Orphanage OVar9;
  Own<capnp::ClientHook,_std::nullptr_t> OVar10;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  initializer_list<unsigned_int> expected;
  initializer_list<unsigned_int> expected_00;
  BuilderFor<capnp::DynamicList> list;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> list_1;
  Builder root;
  Fault f;
  MallocMessageBuilder builder;
  anon_union_8_2_eba6ea51_for_Type_5 local_418;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_410;
  undefined8 local_408;
  OrphanBuilder OStack_400;
  anon_union_8_2_eba6ea51_for_Type_5 local_3d8;
  Type TStack_3d0;
  Schema SStack_3c0;
  anon_union_8_2_eba6ea51_for_Type_5 local_3b8;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_3b0;
  undefined8 local_3a8;
  undefined8 in_stack_fffffffffffffc70;
  anon_union_8_2_eba6ea51_for_Type_5 in_stack_fffffffffffffc78;
  anon_union_8_2_eba6ea51_for_Type_5 aVar11;
  anon_union_8_2_eba6ea51_for_Type_5 in_stack_fffffffffffffc80;
  void *local_378;
  SegmentBuilder *pSStack_370;
  Schema local_358;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_350;
  anon_union_8_2_eba6ea51_for_Type_5 local_348;
  BitsPerElementN<23> in_stack_fffffffffffffcc4;
  BitsPerElementN<23> BVar12;
  WirePointer *in_stack_fffffffffffffcc8;
  undefined8 in_stack_fffffffffffffcd0;
  SegmentBuilder *in_stack_fffffffffffffce0;
  SegmentBuilder *pSVar13;
  anon_union_8_2_eba6ea51_for_Type_5 local_300;
  long local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  uint local_2dc;
  StructBuilder local_2d8;
  StructBuilder local_2b0;
  StructBuilder local_288;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  Reader local_228;
  Builder local_1f0;
  StructReader local_1c0;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> local_190 [48];
  Type local_160;
  SegmentReader *in_stack_fffffffffffffeb0;
  CapTableReader *in_stack_fffffffffffffeb8;
  byte *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  MallocMessageBuilder local_120;
  size_type sVar2;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_418,&local_120.super_MessageBuilder);
  local_3d8 = local_418;
  aVar11 = in_stack_fffffffffffffc78;
  PointerBuilder::getStruct
            ((StructBuilder *)&stack0xfffffffffffffc78,(PointerBuilder *)&local_3d8,
             (StructSize)0x10000,(word *)0x0);
  local_3d8 = aVar11;
  aVar11 = local_3d8;
  TStack_3d0._0_8_ = in_stack_fffffffffffffc80;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
            (local_190,(EVP_PKEY_CTX *)(schemas::s_a0a8f314b80b63fd + 0x48));
  builder_06.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffeb8;
  builder_06.schema.super_Schema.raw = (Schema)(Schema)in_stack_fffffffffffffeb0;
  builder_06.builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffec0;
  builder_06.builder.data = (void *)in_stack_fffffffffffffec8;
  builder_06.builder.pointers = (WirePointer *)in_stack_fffffffffffffed0;
  builder_06.builder.dataSize = (int)in_stack_fffffffffffffed8;
  builder_06.builder.pointerCount = SUB82(in_stack_fffffffffffffed8,4);
  builder_06.builder._38_2_ = SUB82(in_stack_fffffffffffffed8,6);
  initDynamicTestMessage(builder_06);
  StructBuilder::asReader((StructBuilder *)&stack0xfffffffffffffc78);
  bVar7 = local_3b8._4_2_ == 0;
  local_408 = SStack_3c0.raw;
  if (bVar7) {
    local_408 = (RawBrandedSchema *)0;
  }
  OStack_400.tag.content._0_4_ = 0x7fffffff;
  if (!bVar7) {
    OStack_400.tag.content._0_4_ = aStack_3b0._0_4_;
  }
  local_418.scopeId._0_4_ = 0;
  local_418.scopeId._4_4_ = 0;
  aStack_410.scopeId._0_4_ = 0;
  aStack_410.scopeId._4_4_ = 0;
  if (!bVar7) {
    local_418.scopeId._0_4_ = local_3d8.scopeId._0_4_;
    local_418.scopeId._4_4_ = local_3d8.scopeId._4_4_;
    aStack_410.scopeId._0_4_ = TStack_3d0._0_4_;
    aStack_410.scopeId._4_4_ = TStack_3d0._4_4_;
  }
  PointerReader::getStruct(&local_1c0,(PointerReader *)&local_418,(word *)0x0);
  reader_01._reader.capTable = local_1c0.capTable;
  reader_01._reader.segment = local_1c0.segment;
  reader_01._reader.data = local_1c0.data;
  reader_01._reader.pointers = local_1c0.pointers;
  reader_01._reader.dataSize = local_1c0.dataSize;
  reader_01._reader.pointerCount = local_1c0.pointerCount;
  reader_01._reader._38_2_ = local_1c0._38_2_;
  reader_01._reader.nestingLimit = local_1c0.nestingLimit;
  reader_01._reader._44_4_ = local_1c0._44_4_;
  checkTestMessage(reader_01);
  StructBuilder::asReader((StructBuilder *)&stack0xfffffffffffffc78);
  bVar7 = local_3b8._4_2_ != 0;
  local_408 = (RawBrandedSchema *)0;
  if (bVar7) {
    local_408 = SStack_3c0.raw;
  }
  OStack_400.tag.content._0_4_ = 0x7fffffff;
  if (bVar7) {
    OStack_400.tag.content._0_4_ = aStack_3b0._0_4_;
  }
  local_418.scopeId._0_4_ = 0;
  local_418.scopeId._4_4_ = 0;
  aStack_410.scopeId._0_4_ = 0;
  aStack_410.scopeId._4_4_ = 0;
  if (bVar7) {
    local_418.scopeId._0_4_ = local_3d8.scopeId._0_4_;
    local_418.scopeId._4_4_ = local_3d8.scopeId._4_4_;
    aStack_410.scopeId._0_4_ = TStack_3d0._0_4_;
    aStack_410.scopeId._4_4_ = TStack_3d0._4_4_;
  }
  reader.capTable = (CapTableReader *)aStack_410.schema;
  reader.segment = (SegmentReader *)local_418.schema;
  reader.pointer = (WirePointer *)local_408;
  reader._24_8_ = OStack_400.tag.content;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
            (&local_228,reader,(StructSchema)0x6bf168);
  reader_02.reader.segment = local_228.reader.segment;
  reader_02.schema.super_Schema.raw = local_228.schema.super_Schema.raw;
  reader_02.reader.capTable = local_228.reader.capTable;
  reader_02.reader.data = local_228.reader.data;
  reader_02.reader.pointers = local_228.reader.pointers;
  reader_02.reader.dataSize = local_228.reader.dataSize;
  reader_02.reader.pointerCount = local_228.reader.pointerCount;
  reader_02.reader._38_2_ = local_228.reader._38_2_;
  reader_02.reader.nestingLimit = local_228.reader.nestingLimit;
  reader_02.reader._44_4_ = local_228.reader._44_4_;
  checkDynamicTestMessage(reader_02);
  builder_00.capTable = (CapTableBuilder *)in_stack_fffffffffffffc80.schema;
  builder_00.segment = (SegmentBuilder *)aVar11.schema;
  builder_00.pointer = (WirePointer *)pSStack_370;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
            (&local_1f0,builder_00,(StructSchema)0x6bf168);
  builder_03.builder.segment = local_1f0.builder.segment;
  builder_03.schema.super_Schema.raw = local_1f0.schema.super_Schema.raw;
  builder_03.builder.capTable = local_1f0.builder.capTable;
  builder_03.builder.data = local_1f0.builder.data;
  builder_03.builder.pointers = local_1f0.builder.pointers;
  builder_03.builder.dataSize = local_1f0.builder.dataSize;
  builder_03.builder.pointerCount = local_1f0.builder.pointerCount;
  builder_03.builder._38_2_ = local_1f0.builder._38_2_;
  local_3d8 = aVar11;
  checkDynamicTestMessage(builder_03);
  TStack_3d0.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)pSStack_370;
  aVar11 = local_3d8;
  ListSchema::of(UINT32);
  PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::init((EVP_PKEY_CTX *)&local_418);
  local_3d8.scopeId._0_4_ = 3;
  TStack_3d0.baseType = 0x7b;
  TStack_3d0.listDepth = '\0';
  TStack_3d0.isImplicitParam = false;
  TStack_3d0.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  TStack_3d0._6_2_ = 0;
  DynamicList::Builder::set((Builder *)&local_418,0,(Reader *)&local_3d8);
  DynamicValue::Reader::~Reader((Reader *)&local_3d8);
  local_3d8.scopeId._0_4_ = 3;
  TStack_3d0.baseType = 0x1c8;
  TStack_3d0.listDepth = '\0';
  TStack_3d0.isImplicitParam = false;
  TStack_3d0.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  TStack_3d0._6_2_ = 0;
  DynamicList::Builder::set((Builder *)&local_418,1,(Reader *)&local_3d8);
  DynamicValue::Reader::~Reader((Reader *)&local_3d8);
  local_3d8.scopeId._0_4_ = 3;
  TStack_3d0.baseType = 0x315;
  TStack_3d0.listDepth = '\0';
  TStack_3d0.isImplicitParam = false;
  TStack_3d0.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  TStack_3d0._6_2_ = 0;
  DynamicList::Builder::set((Builder *)&local_418,2,(Reader *)&local_3d8);
  DynamicValue::Reader::~Reader((Reader *)&local_3d8);
  local_3d8.scopeId._0_4_ = 3;
  TStack_3d0.baseType = 0xcd15;
  TStack_3d0.listDepth = '[';
  TStack_3d0.isImplicitParam = true;
  TStack_3d0.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  TStack_3d0._6_2_ = 0;
  DynamicList::Builder::set((Builder *)&local_418,3,(Reader *)&local_3d8);
  DynamicValue::Reader::~Reader((Reader *)&local_3d8);
  StructBuilder::asReader((StructBuilder *)&stack0xfffffffffffffc78);
  bVar7 = OStack_400.segment._4_2_ == 0;
  local_348.scopeId = OStack_400.tag.content;
  if (bVar7) {
    local_348 = (anon_union_8_2_eba6ea51_for_Type_5)(WirePointer *)0x0;
  }
  LVar4 = 0x7fffffff;
  if (!bVar7) {
    LVar4 = (ListElementCount)OStack_400.capTable;
  }
  local_358.raw._0_4_ = 0;
  local_358.raw._4_4_ = 0;
  aStack_350.scopeId._0_4_ = 0;
  aStack_350.scopeId._4_4_ = 0;
  if (!bVar7) {
    local_358.raw._0_4_ = local_418.scopeId._0_4_;
    local_358.raw._4_4_ = local_418.scopeId._4_4_;
    aStack_350.scopeId._0_4_ = aStack_410.scopeId._0_4_;
    aStack_350.scopeId._4_4_ = aStack_410.scopeId._4_4_;
  }
  PointerReader::getList
            ((ListReader *)&local_3d8,(PointerReader *)&local_358,FOUR_BYTES,(word *)0x0);
  local_418.scopeId._4_4_ = (uint)SStack_3c0.raw;
  local_418.scopeId._0_4_ = 4;
  aStack_410.schema = (RawBrandedSchema *)0x4d6514;
  local_408 = (RawBrandedSchema *)0x5;
  OStack_400.tag.content._0_1_ = (uint)SStack_3c0.raw == 4;
  if ((uint)SStack_3c0.raw != 4) {
    local_300.scopeId._0_4_ = (uint)SStack_3c0.raw;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ((Fault *)&local_358,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x95,FAILED,"(4u) == (list.size())","_kjCondition,4u, list.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)&local_418,
               (uint *)&stack0xfffffffffffffcd8,(uint *)&local_300.scopeId);
    kj::_::Debug::Fault::fatal((Fault *)&local_358);
  }
  OStack_400.tag.content._0_1_ = *(int *)TStack_3d0.field_4 == 0x7b;
  local_418.scopeId._4_4_ = *(int *)TStack_3d0.field_4;
  local_418.scopeId._0_4_ = 0x7b;
  aStack_410.schema = (RawBrandedSchema *)0x4d6514;
  local_408 = (RawBrandedSchema *)0x5;
  if (kj::_::Debug::minSeverity < 3 && !(bool)(undefined1)OStack_400.tag.content) {
    local_358.raw._0_4_ = 0x7b;
    kj::_::Debug::
    log<char_const(&)[37],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x96,ERROR,
               "\"failed: expected \" \"(123u) == (list[0])\", _kjCondition, 123u, list[0]",
               (char (*) [37])"failed: expected (123u) == (list[0])",
               (DebugComparison<unsigned_int,_unsigned_int> *)&local_418,(uint *)&local_358,
               (uint *)&stack0xfffffffffffffcd8);
  }
  local_418.scopeId._4_4_ =
       *(int *)((long)TStack_3d0.field_4.schema + (ulong)(SStack_3c0.raw._4_4_ >> 3));
  OStack_400.tag.content._0_1_ = local_418.scopeId._4_4_ == 0x1c8;
  local_418.scopeId._0_4_ = 0x1c8;
  aStack_410.schema = (RawBrandedSchema *)0x4d6514;
  local_408 = (RawBrandedSchema *)0x5;
  aVar3 = TStack_3d0.field_4;
  if (kj::_::Debug::minSeverity < 3 && !(bool)(undefined1)OStack_400.tag.content) {
    local_358.raw._0_4_ = 0x1c8;
    kj::_::Debug::
    log<char_const(&)[37],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x97,ERROR,
               "\"failed: expected \" \"(456u) == (list[1])\", _kjCondition, 456u, list[1]",
               (char (*) [37])"failed: expected (456u) == (list[1])",
               (DebugComparison<unsigned_int,_unsigned_int> *)&local_418,(uint *)&local_358,
               (uint *)&stack0xfffffffffffffcd8);
    aVar3 = TStack_3d0.field_4;
  }
  local_418.scopeId._4_4_ = *(int *)((long)aVar3.schema + (ulong)(SStack_3c0.raw._4_4_ >> 2));
  OStack_400.tag.content._0_1_ = local_418.scopeId._4_4_ == 0x315;
  local_418.scopeId._0_4_ = 0x315;
  aStack_410.schema = (RawBrandedSchema *)0x4d6514;
  local_408 = (RawBrandedSchema *)0x5;
  uVar6 = SStack_3c0.raw._4_4_;
  if (kj::_::Debug::minSeverity < 3 && !(bool)(undefined1)OStack_400.tag.content) {
    local_358.raw._0_4_ = 0x315;
    kj::_::Debug::
    log<char_const(&)[37],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x98,ERROR,
               "\"failed: expected \" \"(789u) == (list[2])\", _kjCondition, 789u, list[2]",
               (char (*) [37])"failed: expected (789u) == (list[2])",
               (DebugComparison<unsigned_int,_unsigned_int> *)&local_418,(uint *)&local_358,
               (uint *)&stack0xfffffffffffffcd8);
    aVar3 = TStack_3d0.field_4;
    uVar6 = SStack_3c0.raw._4_4_;
  }
  local_418.scopeId._4_4_ = *(int *)((long)aVar3.schema + ((ulong)uVar6 * 3 >> 3));
  local_418.scopeId._0_4_ = 0x75bcd15;
  aStack_410.schema = (RawBrandedSchema *)0x4d6514;
  local_408 = (RawBrandedSchema *)0x5;
  OStack_400.tag.content._0_1_ = local_418.scopeId._4_4_ == 0x75bcd15;
  if ((local_418.scopeId._4_4_ != 0x75bcd15) && (kj::_::Debug::minSeverity < 3)) {
    local_358.raw._0_4_ = 0x75bcd15;
    kj::_::Debug::
    log<char_const(&)[43],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x99,ERROR,
               "\"failed: expected \" \"(123456789u) == (list[3])\", _kjCondition, 123456789u, list[3]"
               ,(char (*) [43])"failed: expected (123456789u) == (list[3])",
               (DebugComparison<unsigned_int,_unsigned_int> *)&local_418,(uint *)&local_358,
               (uint *)&stack0xfffffffffffffcd8);
  }
  StructBuilder::asReader((StructBuilder *)&stack0xfffffffffffffc78);
  bVar7 = local_3b8._4_2_ != 0;
  local_408 = (RawBrandedSchema *)0;
  if (bVar7) {
    local_408 = SStack_3c0.raw;
  }
  uVar5 = 0x7fffffff;
  if (bVar7) {
    uVar5 = aStack_3b0._0_4_;
  }
  local_418.scopeId._0_4_ = 0;
  local_418.scopeId._4_4_ = 0;
  aStack_410.scopeId._0_4_ = 0;
  aStack_410.scopeId._4_4_ = 0;
  if (bVar7) {
    local_418.scopeId._0_4_ = local_3d8.scopeId._0_4_;
    local_418.scopeId._4_4_ = local_3d8.scopeId._4_4_;
    aStack_410.scopeId._0_4_ = TStack_3d0._0_4_;
    aStack_410.scopeId._4_4_ = TStack_3d0._4_4_;
  }
  OStack_400.tag.content._0_4_ = uVar5;
  LVar8 = ListSchema::of(UINT32);
  sVar2 = LVar8.elementType._0_8_;
  reader_00.capTable = (CapTableReader *)aStack_410.schema;
  reader_00.segment = (SegmentReader *)local_418.schema;
  reader_00.pointer = (WirePointer *)local_408;
  reader_00._24_8_ = OStack_400.tag.content;
  PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic
            ((Reader *)&local_160,reader_00,LVar8);
  local_358.raw = (RawBrandedSchema *)0x1c80000007b;
  aStack_350 = (anon_union_8_2_eba6ea51_for_Type_5)0x75bcd1500000315;
  reader_04.schema.elementType.field_4.schema = local_160.field_4.schema;
  reader_04.schema.elementType.baseType = local_160.baseType;
  reader_04.schema.elementType.listDepth = local_160.listDepth;
  reader_04.schema.elementType.isImplicitParam = local_160.isImplicitParam;
  reader_04.schema.elementType.field_3 = local_160.field_3;
  reader_04.schema.elementType._6_2_ = local_160._6_2_;
  reader_04.reader.segment = in_stack_fffffffffffffeb0;
  reader_04.reader.capTable = in_stack_fffffffffffffeb8;
  reader_04.reader.ptr = in_stack_fffffffffffffec0;
  reader_04.reader.elementCount = (ListElementCount)in_stack_fffffffffffffec8;
  reader_04.reader.step = SUB84(in_stack_fffffffffffffec8,4);
  reader_04.reader.structDataSize = (StructDataBitCount)in_stack_fffffffffffffed0;
  reader_04.reader.structPointerCount = SUB82(in_stack_fffffffffffffed0,4);
  reader_04.reader.elementSize = SUB81(in_stack_fffffffffffffed0,6);
  reader_04.reader._39_1_ = SUB81(in_stack_fffffffffffffed0,7);
  reader_04.reader.nestingLimit = (int)in_stack_fffffffffffffed8;
  reader_04.reader._44_4_ = SUB84(in_stack_fffffffffffffed8,4);
  expected._M_len = sVar2;
  expected._M_array = (iterator)&local_358;
  (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Reader>(reader_04,expected);
  local_3d8 = aVar11;
  aVar11 = local_3d8;
  TStack_3d0._0_8_ = in_stack_fffffffffffffc80;
  LVar8 = ListSchema::of(UINT32);
  sVar2 = LVar8.elementType._0_8_;
  builder_04.capTable = (CapTableBuilder *)aVar11.schema;
  builder_04.segment = (SegmentBuilder *)in_stack_fffffffffffffc70;
  builder_04.pointer = (WirePointer *)in_stack_fffffffffffffc80.schema;
  LVar8.elementType.field_4.schema = (RawBrandedSchema *)TStack_3d0._0_8_;
  LVar8.elementType._0_8_ = local_3d8.schema;
  PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic(builder_04,LVar8);
  local_418.schema = (RawBrandedSchema *)0x1c80000007b;
  aStack_410.schema = (RawBrandedSchema *)0x75bcd1500000315;
  reader_03.schema.elementType.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)uStack_258;
  reader_03.schema.elementType.baseType = (undefined2)local_260;
  reader_03.schema.elementType.listDepth = local_260._2_1_;
  reader_03.schema.elementType.isImplicitParam = (bool)local_260._3_1_;
  reader_03.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_260._4_2_;
  reader_03.schema.elementType._6_2_ = local_260._6_2_;
  reader_03.builder.segment = (SegmentBuilder *)local_250;
  reader_03.builder.capTable = (CapTableBuilder *)uStack_248;
  reader_03.builder.ptr = (byte *)local_240;
  reader_03.builder.elementCount = (undefined4)uStack_238;
  reader_03.builder.step = uStack_238._4_4_;
  reader_03.builder.structDataSize = (undefined4)local_230;
  reader_03.builder.structPointerCount = local_230._4_2_;
  reader_03.builder.elementSize = local_230._6_1_;
  reader_03.builder._39_1_ = local_230._7_1_;
  expected_00._M_len = sVar2;
  expected_00._M_array = (iterator)&local_418;
  (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Builder>(reader_03,expected_00);
  local_418.schema = (RawBrandedSchema *)&PTR_s_e3da5a2ccd28c0d8_006bf278;
  local_3d8.scopeId._0_4_ = 6;
  TStack_3d0.field_4.scopeId = 4;
  TStack_3d0._0_8_ = "foo";
  name.content.size_ = 0x10;
  name.content.ptr = "anyPointerField";
  DynamicStruct::Builder::set((Builder *)&local_418,name,(Reader *)&local_3d8);
  DynamicValue::Reader::~Reader((Reader *)&local_3d8);
  uVar6 = 0x4d62b5;
  uVar5 = 0;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&local_358,(PointerBuilder *)&local_418,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&local_3d8,
             (DebugExpression<char_const(&)[4]> *)&stack0xfffffffffffffcd8,(Builder *)&local_358);
  if (((char)local_3a8 == '\0') && (kj::_::Debug::minSeverity < 3)) {
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_358,(PointerBuilder *)&local_418,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[70],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0xa4,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (root.getAnyPointerField().getAs<Text>())\", _kjCondition, \"foo\", root.getAnyPointerField().getAs<Text>()"
               ,(char (*) [70])
                "failed: expected (\"foo\") == (root.getAnyPointerField().getAs<Text>())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)&local_3d8,
               (char (*) [4])"foo",(Builder *)&local_358);
  }
  OVar9 = MessageBuilder::getOrphanage(&local_120.super_MessageBuilder);
  OrphanBuilder::initStruct
            ((OrphanBuilder *)&local_3d8,OVar9.arena,OVar9.capTable,(StructSize)0x140006);
  TVar1 = TStack_3d0;
  local_2f8._0_2_ = TStack_3d0.baseType;
  local_2f8._2_1_ = TStack_3d0.listDepth;
  local_2f8._3_1_ = TStack_3d0.isImplicitParam;
  local_2f8._4_2_ = TStack_3d0.field_3;
  local_2f8._6_2_ = TStack_3d0._6_2_;
  uStack_2f0 = TStack_3d0.field_4;
  local_2e8 = SStack_3c0.raw;
  local_300.schema = local_3d8.schema;
  TStack_3d0 = TVar1;
  OrphanBuilder::asStruct(&local_288,(OrphanBuilder *)&local_300,(StructSize)0x140006);
  builder_05._builder.segment._4_4_ = in_stack_fffffffffffffcc4;
  builder_05._builder.segment._0_4_ = LVar4;
  builder_05._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffcc8;
  builder_05._builder.data = (void *)in_stack_fffffffffffffcd0;
  builder_05._builder.pointers._0_4_ = uVar6;
  builder_05._builder.pointers._4_4_ = uVar5;
  builder_05._builder._32_8_ = in_stack_fffffffffffffce0;
  initTestMessage(builder_05);
  OStack_400.segment = pSStack_370;
  local_418.schema = (RawBrandedSchema *)&PTR_s_e3da5a2ccd28c0d8_006bf278;
  OrphanBuilder::asStructReader
            ((StructReader *)&local_358,(OrphanBuilder *)&local_300,(StructSize)0x140006);
  aStack_3b0 = (anon_union_8_2_eba6ea51_for_Type_5)CONCAT44(in_stack_fffffffffffffcc4,LVar4);
  local_3b8 = local_348;
  SStack_3c0.raw = aStack_350.schema;
  local_3d8.scopeId._0_4_ = 10;
  TStack_3d0._0_8_ = schemas::s_a0a8f314b80b63fd + 0x48;
  TStack_3d0.field_4.schema = local_358.raw;
  name_00.content.size_ = 0x10;
  name_00.content.ptr = "anyPointerField";
  DynamicStruct::Builder::set((Builder *)&local_418,name_00,(Reader *)&local_3d8);
  DynamicValue::Reader::~Reader((Reader *)&local_3d8);
  local_3d8 = aVar11;
  aVar11 = local_3d8;
  PointerBuilder::getStruct
            (&local_2b0,(PointerBuilder *)&local_3d8,(StructSize)0x140006,(word *)0x0);
  builder_01._builder.capTable = local_2b0.capTable;
  builder_01._builder.segment = local_2b0.segment;
  builder_01._builder.data = local_2b0.data;
  builder_01._builder.pointers = local_2b0.pointers;
  builder_01._builder.dataSize = local_2b0.dataSize;
  builder_01._builder.pointerCount = local_2b0.pointerCount;
  builder_01._builder._38_2_ = local_2b0._38_2_;
  checkTestMessage(builder_01);
  LVar4 = (ListElementCount)local_378;
  BVar12 = (BitsPerElementN<23>)((ulong)local_378 >> 0x20);
  local_358.raw = (RawBrandedSchema *)&PTR_s_e3da5a2ccd28c0d8_006bf278;
  aStack_350 = aVar11;
  local_348 = in_stack_fffffffffffffc80;
  OrphanBuilder::asStruct
            ((StructBuilder *)&stack0xfffffffffffffcd8,(OrphanBuilder *)&local_300,
             (StructSize)0x140006);
  SStack_3c0.raw = (RawBrandedSchema *)in_stack_fffffffffffffce0;
  TStack_3d0.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)CONCAT44(uVar5,uVar6);
  local_3d8.scopeId._0_4_ = 10;
  TStack_3d0._0_8_ = schemas::s_a0a8f314b80b63fd + 0x48;
  Orphan<capnp::DynamicValue>::Orphan
            ((Orphan<capnp::DynamicValue> *)&local_418,(Builder *)&local_3d8,
             (OrphanBuilder *)&local_300);
  DynamicValue::Builder::~Builder((Builder *)&local_3d8);
  name_01.content.size_ = 0x10;
  name_01.content.ptr = "anyPointerField";
  DynamicStruct::Builder::adopt
            ((Builder *)&local_358,name_01,(Orphan<capnp::DynamicValue> *)&local_418);
  if (OStack_400.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&OStack_400);
  }
  local_3d8 = aVar11;
  TStack_3d0.field_4.schema = (RawBrandedSchema *)pSStack_370;
  TStack_3d0._0_8_ = in_stack_fffffffffffffc80.schema;
  aVar11 = local_3d8;
  PointerBuilder::getStruct
            (&local_2d8,(PointerBuilder *)&local_3d8,(StructSize)0x140006,(word *)0x0);
  builder_02._builder.capTable = local_2d8.capTable;
  builder_02._builder.segment = local_2d8.segment;
  builder_02._builder.data = local_2d8.data;
  builder_02._builder.pointers = local_2d8.pointers;
  builder_02._builder.dataSize = local_2d8.dataSize;
  builder_02._builder.pointerCount = local_2d8.pointerCount;
  builder_02._builder._38_2_ = local_2d8._38_2_;
  checkTestMessage(builder_02);
  if (local_2f8 != 0) {
    OrphanBuilder::euthanize((OrphanBuilder *)&local_300);
  }
  OVar9 = MessageBuilder::getOrphanage(&local_120.super_MessageBuilder);
  OrphanBuilder::initList((OrphanBuilder *)&local_3d8,OVar9.arena,OVar9.capTable,3,FOUR_BYTES);
  uVar6 = (uint)local_3d8.scopeId;
  uVar5 = (undefined4)((ulong)local_3d8 >> 0x20);
  OrphanBuilder::asList
            ((ListBuilder *)&local_3d8,(OrphanBuilder *)&stack0xfffffffffffffcd8,FOUR_BYTES);
  *(undefined4 *)TStack_3d0.field_4 = 0xc;
  OrphanBuilder::asList
            ((ListBuilder *)&local_3d8,(OrphanBuilder *)&stack0xfffffffffffffcd8,FOUR_BYTES);
  *(undefined4 *)((long)TStack_3d0.field_4 + ((ulong)SStack_3c0.raw >> 0x23)) = 0x22;
  OrphanBuilder::asList
            ((ListBuilder *)&local_3d8,(OrphanBuilder *)&stack0xfffffffffffffcd8,FOUR_BYTES);
  *(undefined4 *)((long)TStack_3d0.field_4 + ((ulong)SStack_3c0.raw >> 0x22)) = 0x38;
  OStack_400.tag.content = (uint64_t)local_378;
  local_418.schema = (RawBrandedSchema *)&PTR_s_e3da5a2ccd28c0d8_006bf278;
  OrphanBuilder::asListReader
            ((ListReader *)&local_358,(OrphanBuilder *)&stack0xfffffffffffffcd8,FOUR_BYTES);
  pSVar13 = (SegmentBuilder *)TStack_3d0._0_8_;
  TStack_3d0 = (Type)ListSchema::of(UINT32);
  local_3a8 = CONCAT44(BVar12,LVar4);
  aStack_3b0 = local_348;
  SStack_3c0.raw = local_358.raw;
  local_3b8 = aStack_350;
  local_3d8.scopeId._0_4_ = 8;
  name_02.content.size_ = 0x10;
  name_02.content.ptr = "anyPointerField";
  DynamicStruct::Builder::set((Builder *)&local_418,name_02,(Reader *)&local_3d8);
  DynamicValue::Reader::~Reader((Reader *)&local_3d8);
  PointerBuilder::getList
            ((ListBuilder *)&local_3d8,(PointerBuilder *)&local_418,FOUR_BYTES,(word *)0x0);
  local_418.scopeId._4_4_ = (uint)SStack_3c0.raw;
  local_418.scopeId._0_4_ = 3;
  aStack_410.schema = (RawBrandedSchema *)0x4d6514;
  local_408 = (RawBrandedSchema *)0x5;
  OStack_400.tag.content._0_1_ = (uint)SStack_3c0.raw == 3;
  if ((uint)SStack_3c0.raw == 3) {
    OStack_400.tag.content._0_1_ = *(int *)&(TStack_3d0.field_4.schema)->generic == 0xc;
    local_418.scopeId._4_4_ = *(int *)&(TStack_3d0.field_4.schema)->generic;
    local_418.scopeId._0_4_ = 0xc;
    aStack_410.schema = (RawBrandedSchema *)0x4d6514;
    local_408 = (RawBrandedSchema *)0x5;
    if (kj::_::Debug::minSeverity < 3 && !(bool)(undefined1)OStack_400.tag.content) {
      local_358.raw._0_4_ = 0xc;
      local_300.scopeId._0_4_ = *(undefined4 *)&(TStack_3d0.field_4.schema)->generic;
      kj::_::Debug::
      log<char_const(&)[32],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xb8,ERROR,"\"failed: expected \" \"(12) == (l[0])\", _kjCondition, 12, l[0]",
                 (char (*) [32])"failed: expected (12) == (l[0])",
                 (DebugComparison<int,_unsigned_int> *)&local_418,(int *)&local_358,
                 (uint *)&local_300.scopeId);
    }
    local_418.scopeId._4_4_ =
         *(int *)((long)&(TStack_3d0.field_4.schema)->generic + (ulong)(SStack_3c0.raw._4_4_ >> 3));
    OStack_400.tag.content._0_1_ = local_418.scopeId._4_4_ == 0x22;
    local_418.scopeId._0_4_ = 0x22;
    aStack_410.schema = (RawBrandedSchema *)0x4d6514;
    local_408 = (RawBrandedSchema *)0x5;
    aVar3 = TStack_3d0.field_4;
    if (kj::_::Debug::minSeverity < 3 && !(bool)(undefined1)OStack_400.tag.content) {
      local_358.raw._0_4_ = 0x22;
      local_300.scopeId._0_4_ =
           *(undefined4 *)
            ((long)&(TStack_3d0.field_4.schema)->generic + (ulong)(SStack_3c0.raw._4_4_ >> 3));
      kj::_::Debug::
      log<char_const(&)[32],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xb9,ERROR,"\"failed: expected \" \"(34) == (l[1])\", _kjCondition, 34, l[1]",
                 (char (*) [32])"failed: expected (34) == (l[1])",
                 (DebugComparison<int,_unsigned_int> *)&local_418,(int *)&local_358,
                 (uint *)&local_300.scopeId);
      aVar3.scopeId = TStack_3d0.field_4.scopeId;
    }
    local_418.scopeId._4_4_ =
         *(int *)((long)&(aVar3.schema)->generic + (ulong)(SStack_3c0.raw._4_4_ >> 2));
    local_418.scopeId._0_4_ = 0x38;
    aStack_410.schema = (RawBrandedSchema *)0x4d6514;
    local_408 = (RawBrandedSchema *)0x5;
    OStack_400.tag.content._0_1_ = local_418.scopeId._4_4_ == 0x38;
    if ((local_418.scopeId._4_4_ != 0x38) && (kj::_::Debug::minSeverity < 3)) {
      local_358.raw._0_4_ = 0x38;
      local_300.scopeId._0_4_ =
           *(undefined4 *)((long)&(aVar3.schema)->generic + (ulong)(SStack_3c0.raw._4_4_ >> 2));
      kj::_::Debug::
      log<char_const(&)[32],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xba,ERROR,"\"failed: expected \" \"(56) == (l[2])\", _kjCondition, 56, l[2]",
                 (char (*) [32])"failed: expected (56) == (l[2])",
                 (DebugComparison<int,_unsigned_int> *)&local_418,(int *)&local_358,
                 (uint *)&local_300.scopeId);
    }
    if (pSVar13 != (SegmentBuilder *)0x0) {
      OrphanBuilder::euthanize((OrphanBuilder *)&stack0xfffffffffffffcd8);
    }
    aStack_410 = aVar11;
    local_418.schema = (RawBrandedSchema *)&PTR_s_e3da5a2ccd28c0d8_006bf278;
    Capability::Client::Client((Client *)&stack0xfffffffffffffcd8,(void *)0x0);
    (*(code *)(pSVar13->super_SegmentReader).arena[4]._vptr_Arena)(&local_358);
    local_3d8.scopeId._0_4_ = 0xb;
    TStack_3d0._0_8_ = local_358.raw;
    SStack_3c0.raw = (RawBrandedSchema *)(NULL_INTERFACE_SCHEMA + 0x48);
    name_03.content.size_ = 0x10;
    name_03.content.ptr = "anyPointerField";
    DynamicStruct::Builder::set((Builder *)&local_418,name_03,(Reader *)&local_3d8);
    DynamicValue::Reader::~Reader((Reader *)&local_3d8);
    if (pSVar13 != (SegmentBuilder *)0x0) {
      (*(code *)**(undefined8 **)CONCAT44(uVar5,uVar6))
                ((undefined8 *)CONCAT44(uVar5,uVar6),
                 (_func_int *)
                 ((long)(pSVar13->super_SegmentReader).arena[-2]._vptr_Arena +
                 (long)&(pSVar13->super_SegmentReader).arena));
    }
    OVar10 = PointerBuilder::getCapability((PointerBuilder *)&local_418);
    if (aStack_410.schema != (RawBrandedSchema *)0x0) {
      (*(code *)(local_418.schema)->generic->id)
                (local_418.schema,
                 (long)&(aStack_410.schema)->generic +
                 (long)(aStack_410.schema)->generic[-1].defaultBrand.lazyInitializer,OVar10.ptr);
    }
    MallocMessageBuilder::~MallocMessageBuilder(&local_120);
    return;
  }
  local_300.scopeId._0_4_ = 3;
  local_2dc = (uint)SStack_3c0.raw;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
            ((Fault *)&local_358,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
             ,0xb7,FAILED,"(3) == (l.size())","_kjCondition,3, l.size()",
             (DebugComparison<int,_unsigned_int> *)&local_418,(int *)&local_300.scopeId,&local_2dc);
  kj::_::Debug::Fault::fatal((Fault *)&local_358);
}

Assistant:

TEST(DynamicApi, AnyPointers) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyPointer>();

  initDynamicTestMessage(
      root.getAnyPointerField().initAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkTestMessage(root.asReader().getAnyPointerField().getAs<TestAllTypes>());

  checkDynamicTestMessage(
      root.asReader().getAnyPointerField().getAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkDynamicTestMessage(
      root.getAnyPointerField().getAs<DynamicStruct>(Schema::from<TestAllTypes>()));

  {
    {
      auto list = root.getAnyPointerField().initAs<DynamicList>(Schema::from<List<uint32_t>>(), 4);
      list.set(0, 123);
      list.set(1, 456);
      list.set(2, 789);
      list.set(3, 123456789);
    }

    {
      auto list = root.asReader().getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(4u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
      EXPECT_EQ(123456789u, list[3]);
    }

    checkList<uint32_t>(root.asReader().getAnyPointerField().getAs<DynamicList>(
        Schema::from<List<uint32_t>>()), {123u, 456u, 789u, 123456789u});
    checkList<uint32_t>(root.getAnyPointerField().getAs<DynamicList>(
        Schema::from<List<uint32_t>>()), {123u, 456u, 789u, 123456789u});
  }

  // Setting an AnyPointer to various types should work.
  toDynamic(root).set("anyPointerField", capnp::Text::Reader("foo"));
  EXPECT_EQ("foo", root.getAnyPointerField().getAs<Text>());

  {
    auto orphan = builder.getOrphanage().newOrphan<TestAllTypes>();
    initTestMessage(orphan.get());
    toDynamic(root).set("anyPointerField", orphan.getReader());
    checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());

    toDynamic(root).adopt("anyPointerField", kj::mv(orphan));
    checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());
  }

  {
    auto lorphan = builder.getOrphanage().newOrphan<List<uint32_t>>(3);
    lorphan.get().set(0, 12);
    lorphan.get().set(1, 34);
    lorphan.get().set(2, 56);
    toDynamic(root).set("anyPointerField", lorphan.getReader());
    auto l = root.getAnyPointerField().getAs<List<uint32_t>>();
    ASSERT_EQ(3, l.size());
    EXPECT_EQ(12, l[0]);
    EXPECT_EQ(34, l[1]);
    EXPECT_EQ(56, l[2]);
  }

  // Just compile this one.
  toDynamic(root).set("anyPointerField", Capability::Client(nullptr));
  root.getAnyPointerField().getAs<Capability>();
}